

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2TextureHeader(LWOImporter *this,uint size,Texture *tex)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  long lVar4;
  Logger *this_00;
  DeadlyImportError *this_01;
  ulong uVar5;
  float fVar6;
  uint8_t *next;
  allocator<char> local_51;
  string local_50;
  SubChunkHeader local_30;
  SubChunkHeader head;
  uint8_t *end;
  Texture *tex_local;
  uint size_local;
  LWOImporter *this_local;
  
  head = (SubChunkHeader)((long)this->mFileBuffer + (ulong)size);
  GetS0(this,&tex->ordinal,size);
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"LWO2: Ill-formed SURF.BLOK ordinal string");
    std::__cxx11::string::operator=((string *)&tex->ordinal,"");
  }
  while( true ) {
    if ((ulong)head <= (long)this->mFileBuffer + 6U) {
      return;
    }
    local_30 = IFF::LoadSubChunk(&this->mFileBuffer);
    if ((ulong)head < (ulong)((long)this->mFileBuffer + (long)(int)(uint)local_30.length)) break;
    puVar1 = this->mFileBuffer;
    uVar5 = (ulong)local_30.length;
    if (local_30.type == 0x4348414e) {
      uVar3 = GetU4(this);
      tex->type = uVar3;
    }
    else if (local_30.type == 0x454e4142) {
      uVar2 = GetU2(this);
      tex->enabled = (bool)(-(uVar2 != 0) & 1);
    }
    else if (local_30.type == 0x4f504143) {
      uVar2 = GetU2(this);
      tex->blendType = (uint)uVar2;
      fVar6 = GetF4(this);
      tex->mStrength = fVar6;
    }
    this->mFileBuffer = puVar1 + uVar5;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"LWO2: Invalid texture header chunk length",&local_51);
  DeadlyImportError::DeadlyImportError(this_01,&local_50);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::LoadLWO2TextureHeader(unsigned int size, LWO::Texture& tex )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    // get the ordinal string
    GetS0( tex.ordinal, size);

    // we could crash later if this is an empty string ...
    if (!tex.ordinal.length())
    {
        ASSIMP_LOG_ERROR("LWO2: Ill-formed SURF.BLOK ordinal string");
        tex.ordinal = "\x00";
    }
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid texture header chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_CHAN:
            tex.type = GetU4();
            break;
        case AI_LWO_ENAB:
            tex.enabled = GetU2() ? true : false;
            break;
        case AI_LWO_OPAC:
            tex.blendType = (Texture::BlendType)GetU2();
            tex.mStrength = GetF4();
            break;
        }
        mFileBuffer = next;
    }
}